

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void api_suite::api_string_output(void)

{
  undefined4 local_17c;
  string result;
  char input [8];
  decoder_type decoder;
  
  builtin_strncpy(input,"\"alpha\"",8);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>(&decoder,&input);
  result._M_dataplus._M_p._0_4_ = decoder.current.code;
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x79,"void api_suite::api_string_output()",&result,&local_17c);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&decoder,&result);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7c,"void api_suite::api_string_output()",&result,"alpha");
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void api_string_output()
{
    const char input[] = "\"alpha\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    std::string result;
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.string_value<std::string>(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
}